

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.h
# Opt level: O0

float math::fastpow<float>(float *base,uint exp)

{
  undefined4 local_24;
  undefined4 local_20;
  uint i;
  uint exp2;
  float ret;
  uint exp_local;
  float *base_local;
  
  if (exp == 0) {
    local_24 = 1.0;
  }
  else {
    local_24 = *base;
  }
  i = (uint)local_24;
  for (local_20 = 1; local_20 <= exp >> 1; local_20 = local_20 << 1) {
    i = (uint)((float)i * (float)i);
  }
  for (; local_20 < exp; local_20 = local_20 + 1) {
    i = (uint)((float)i * *base);
  }
  return (float)i;
}

Assistant:

T
fastpow (T const& base, unsigned int exp)
{
    T ret = (exp == 0 ? T(1) : base);
    unsigned int const exp2 = exp / 2;
    unsigned int i = 1;
    for (; i <= exp2; i = i * 2)
        ret = ret * ret;
    for (; i < exp; ++i)
        ret = ret * base;
    return ret;
}